

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  Message **ppMVar6;
  Message **ppMVar7;
  undefined4 extraout_var;
  Message *default_message;
  Message **result_holder;
  Message *result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  result = (Message *)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message *)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (GeneratedMessageReflection *)
                 ExtensionSet::MutableMessage(this_00,field,(MessageFactory *)result);
  }
  else {
    ppMVar6 = MutableField<google::protobuf::Message*>(this,message,field);
    if (*ppMVar6 == (Message *)0x0) {
      ppMVar7 = DefaultRaw<google::protobuf::Message_const*>(this,field);
      iVar4 = (*((*ppMVar7)->super_MessageLite)._vptr_MessageLite[3])();
      *ppMVar6 = (Message *)CONCAT44(extraout_var,iVar4);
    }
    this_local = (GeneratedMessageReflection *)*ppMVar6;
  }
  return (Message *)this_local;
}

Assistant:

Message* GeneratedMessageReflection::MutableMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;
    Message** result_holder = MutableField<Message*>(message, field);
    if (*result_holder == NULL) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New();
    }
    result = *result_holder;
    return result;
  }
}